

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::getDataVector2(GLTextureBuffer *this)

{
  int iVar1;
  TextureBuffer *in_RSI;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *in_RDI;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *outData;
  TextureFormat *in_stack_ffffffffffffffc8;
  string local_30 [32];
  TextureBuffer *message;
  
  message = in_RSI;
  iVar1 = dimension(in_stack_ffffffffffffffc8);
  if (iVar1 != 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,
               "called getDataVector2 on texture which does not have a 2 dimensional format",
               (allocator *)&stack0xffffffffffffffcf);
    exception((string *)message);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)0x511846);
  TextureBuffer::getSizeX(in_RSI);
  TextureBuffer::getSizeY(in_RSI);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::resize((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)in_RSI,(size_type)in_RDI);
  return in_RDI;
}

Assistant:

std::vector<glm::vec2> GLTextureBuffer::getDataVector2() {
  if (dimension(format) != 2) exception("called getDataVector2 on texture which does not have a 2 dimensional format");

  std::vector<glm::vec2> outData;
  outData.resize(getSizeX() * getSizeY());

  return outData;
}